

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O0

void __thiscall MT32Emu::BReverbModelImpl<float>::mute(BReverbModelImpl<float> *this)

{
  uint local_18;
  uint local_14;
  Bit32u i_1;
  Bit32u i;
  BReverbModelImpl<float> *this_local;
  
  if (this->allpasses != (AllpassFilter<float> **)0x0) {
    for (local_14 = 0; local_14 < this->currentSettings->numberOfAllpasses; local_14 = local_14 + 1)
    {
      RingBuffer<float>::mute(&this->allpasses[local_14]->super_RingBuffer<float>);
    }
  }
  if (this->combs != (CombFilter<float> **)0x0) {
    for (local_18 = 0; local_18 < this->currentSettings->numberOfCombs; local_18 = local_18 + 1) {
      RingBuffer<float>::mute(&this->combs[local_18]->super_RingBuffer<float>);
    }
  }
  return;
}

Assistant:

void mute() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i]->mute();
			}
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				combs[i]->mute();
			}
		}
	}